

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

carray<long,_7UL> *
frozen::knuth_morris_pratt_searcher<7UL>::build_kmp_cache
          (carray<long,_7UL> *__return_storage_ptr__,char (*needle) [8])

{
  value_type_conflict3 vVar1;
  size_t sVar2;
  reference pvVar3;
  size_t *psVar4;
  bool bVar5;
  ulong local_28;
  size_t pos;
  size_t local_18;
  ptrdiff_t cnd;
  char (*needle_local) [8];
  
  local_18 = 0;
  pos = 0xffffffffffffffff;
  cnd = (ptrdiff_t)needle;
  bits::carray<long,_7UL>::carray(__return_storage_ptr__,(value_type_conflict3 *)&pos);
  for (local_28 = 1; sVar2 = local_18, local_28 < 7; local_28 = local_28 + 1) {
    if (*(char *)(cnd + local_28) == *(char *)(cnd + local_18)) {
      pvVar3 = bits::carray<long,_7UL>::operator[](__return_storage_ptr__,local_18);
      vVar1 = *pvVar3;
      pvVar3 = bits::carray<long,_7UL>::operator[](__return_storage_ptr__,local_28);
      *pvVar3 = vVar1;
    }
    else {
      psVar4 = (size_t *)bits::carray<long,_7UL>::operator[](__return_storage_ptr__,local_28);
      *psVar4 = sVar2;
      psVar4 = (size_t *)bits::carray<long,_7UL>::operator[](__return_storage_ptr__,local_18);
      local_18 = *psVar4;
      while( true ) {
        bVar5 = false;
        if (-1 < (long)local_18) {
          bVar5 = *(char *)(cnd + local_28) != *(char *)(cnd + local_18);
        }
        if (!bVar5) break;
        psVar4 = (size_t *)bits::carray<long,_7UL>::operator[](__return_storage_ptr__,local_18);
        local_18 = *psVar4;
      }
    }
    local_18 = local_18 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static constexpr bits::carray<std::ptrdiff_t, size>
  build_kmp_cache(char const (&needle)[size + 1]) {
    std::ptrdiff_t cnd = 0;
    bits::carray<std::ptrdiff_t, size> cache(-1);
    for (std::size_t pos = 1; pos < size; ++pos) {
      if (needle[pos] == needle[cnd]) {
        cache[pos] = cache[cnd];
        cnd += 1;
      } else {
        cache[pos] = cnd;
        cnd = cache[cnd];
        while (cnd >= 0 && needle[pos] != needle[cnd])
          cnd = cache[cnd];
        cnd += 1;
      }
    }
    return cache;
  }